

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::default_value_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  float value;
  double value_00;
  FieldDescriptor FVar1;
  long lVar2;
  Type TVar3;
  int iVar4;
  Descriptor *pDVar5;
  long *plVar6;
  LogMessage *other;
  size_type *psVar7;
  unsigned_long i;
  char *pcVar8;
  char *pcVar9;
  size_type __dnew;
  LogFinisher local_51;
  undefined1 local_50 [56];
  
  while (TVar3 = FieldDescriptor::type(descriptor), TVar3 - TYPE_GROUP < 2) {
    TVar3 = FieldDescriptor::type(descriptor);
    if (TVar3 != TYPE_MESSAGE) {
LAB_002664dd:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "null";
      pcVar8 = "";
      goto LAB_002667f0;
    }
    pDVar5 = FieldDescriptor::message_type(descriptor);
    pcVar8 = "google/protobuf/wrappers.proto";
    iVar4 = std::__cxx11::string::compare((char *)**(undefined8 **)(pDVar5 + 0x10));
    if (iVar4 != 0) goto LAB_002664dd;
    pDVar5 = FieldDescriptor::message_type(descriptor);
    descriptor = *(FieldDescriptor **)(pDVar5 + 0x30);
    this = (FieldGeneratorBase *)pcVar8;
  }
  switch(TVar3) {
  case TYPE_DOUBLE:
    value_00 = *(double *)(descriptor + 0xa0);
    if (INFINITY <= value_00) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "double.PositiveInfinity";
      pcVar8 = "";
      goto LAB_002667f0;
    }
    if (value_00 <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "double.NegativeInfinity";
      pcVar8 = "";
      goto LAB_002667f0;
    }
    if (NAN(value_00)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "double.NaN";
      pcVar8 = "";
      goto LAB_002667f0;
    }
    SimpleDtoa_abi_cxx11_((string *)local_50,(protobuf *)this,value_00);
    std::operator+(__return_storage_ptr__,(string *)local_50,"D");
    goto LAB_002666fa;
  case TYPE_FLOAT:
    value = *(float *)(descriptor + 0xa0);
    if (value < INFINITY) {
      if (-INFINITY < value) {
        if (!NAN(value)) {
          SimpleFtoa_abi_cxx11_((string *)local_50,(protobuf *)this,value);
          std::operator+(__return_storage_ptr__,(string *)local_50,"F");
          goto LAB_002666fa;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar9 = "float.NaN";
        pcVar8 = "";
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar9 = "float.NegativeInfinity";
        pcVar8 = "";
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "float.PositiveInfinity";
      pcVar8 = "";
    }
    goto LAB_002667f0;
  case TYPE_INT64:
    SimpleItoa_abi_cxx11_((string *)local_50,*(protobuf **)(descriptor + 0xa0),i);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
    break;
  case TYPE_UINT64:
    SimpleItoa_abi_cxx11_((string *)local_50,*(protobuf **)(descriptor + 0xa0),i);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
    break;
  case TYPE_INT32:
  case TYPE_SFIXED32:
  case TYPE_SINT32:
    SimpleItoa_abi_cxx11_
              (__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(descriptor + 0xa0),(uint)i);
    return __return_storage_ptr__;
  case TYPE_FIXED64:
    SimpleItoa_abi_cxx11_((string *)local_50,*(protobuf **)(descriptor + 0xa0),i);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
    break;
  case TYPE_FIXED32:
  case TYPE_UINT32:
    SimpleItoa_abi_cxx11_
              (__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(descriptor + 0xa0),(uint)i);
    return __return_storage_ptr__;
  case TYPE_BOOL:
    FVar1 = descriptor[0xa0];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (FVar1 == (FieldDescriptor)0x1) {
      pcVar9 = "true";
      pcVar8 = "";
    }
    else {
      pcVar9 = "false";
      pcVar8 = "";
    }
    goto LAB_002667f0;
  case TYPE_STRING:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(undefined2 *)&__return_storage_ptr__->field_2 = 0x2222;
    __return_storage_ptr__->_M_string_length = 2;
    (__return_storage_ptr__->field_2)._M_local_buf[2] = '\0';
    return __return_storage_ptr__;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x178);
    other = internal::LogMessage::operator<<((LogMessage *)local_50,"Unknown field type.");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_50);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "";
    pcVar9 = "";
    goto LAB_002667f0;
  case TYPE_BYTES:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_50._0_8_ = (pointer)0x14;
    pcVar8 = (char *)std::__cxx11::string::_M_create
                               ((ulong *)__return_storage_ptr__,(ulong)local_50);
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_50._0_8_;
    builtin_strncpy(pcVar8,"pb::ByteString.Empty",0x14);
    __return_storage_ptr__->_M_string_length = local_50._0_8_;
    *(char *)(local_50._0_8_ + (long)(__return_storage_ptr__->_M_dataplus)._M_p) = '\0';
    return __return_storage_ptr__;
  case TYPE_ENUM:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "0";
    pcVar8 = "";
LAB_002667f0:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar8);
    return __return_storage_ptr__;
  case TYPE_SFIXED64:
    SimpleItoa_abi_cxx11_((string *)local_50,*(protobuf **)(descriptor + 0xa0),i);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
    break;
  case MAX_TYPE:
    SimpleItoa_abi_cxx11_((string *)local_50,*(protobuf **)(descriptor + 0xa0),i);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar7) {
    lVar2 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
LAB_002666fa:
  if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::default_value(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      // All proto3 enums have a default value of 0, and there's an implicit conversion from the constant 0 to
      // any C# enum. This means we don't need to work out what we actually mapped the enum value name to.
     return "0";
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field = descriptor->message_type()->field(0);
        return default_value(wrapped_field);
      } else {
        return "null";
      }
    case FieldDescriptor::TYPE_DOUBLE: {
      double value = descriptor->default_value_double();
      if (value == numeric_limits<double>::infinity()) {
        return "double.PositiveInfinity";
      } else if (value == -numeric_limits<double>::infinity()) {
        return "double.NegativeInfinity";
      } else if (MathLimits<double>::IsNaN(value)) {
        return "double.NaN";
      }
      return SimpleDtoa(value) + "D";
    }
    case FieldDescriptor::TYPE_FLOAT: {
      float value = descriptor->default_value_float();
      if (value == numeric_limits<float>::infinity()) {
        return "float.PositiveInfinity";
      } else if (value == -numeric_limits<float>::infinity()) {
        return "float.NegativeInfinity";
      } else if (MathLimits<float>::IsNaN(value)) {
        return "float.NaN";
      }
      return SimpleFtoa(value) + "F";
    }
    case FieldDescriptor::TYPE_INT64:
      return SimpleItoa(descriptor->default_value_int64()) + "L";
    case FieldDescriptor::TYPE_UINT64:
      return SimpleItoa(descriptor->default_value_uint64()) + "UL";
    case FieldDescriptor::TYPE_INT32:
      return SimpleItoa(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_FIXED64:
      return SimpleItoa(descriptor->default_value_uint64()) + "UL";
    case FieldDescriptor::TYPE_FIXED32:
      return SimpleItoa(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_BOOL:
      if (descriptor->default_value_bool()) {
        return "true";
      } else {
        return "false";
      }
    case FieldDescriptor::TYPE_STRING:
      return GetStringDefaultValueInternal();
    case FieldDescriptor::TYPE_BYTES:
      return GetBytesDefaultValueInternal();
    case FieldDescriptor::TYPE_UINT32:
      return SimpleItoa(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_SFIXED32:
      return SimpleItoa(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SFIXED64:
      return SimpleItoa(descriptor->default_value_int64()) + "L";
    case FieldDescriptor::TYPE_SINT32:
      return SimpleItoa(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SINT64:
      return SimpleItoa(descriptor->default_value_int64()) + "L";
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return "";
  }
}